

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall
kj::anon_unknown_35::InMemoryDirectory::SymlinkNode::parse
          (Path *__return_storage_ptr__,SymlinkNode *this)

{
  StringPtr path;
  anon_class_8_1_8991fb9c _kjContextFunc1364;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1364:7)>
  _kjContext1364;
  Context local_70;
  undefined1 *local_28;
  
  _::Debug::Context::Context(&local_70);
  local_70.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_00289b08;
  path.content.size_ = (size_t)this;
  path.content.ptr = (char *)0x2185d1;
  local_28 = &stack0xffffffffffffff88;
  Path::parse(path);
  _::Debug::Context::~Context(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Path parse() const {
      KJ_CONTEXT("parsing symlink", content);
      return Path::parse(content);
    }